

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

int uv_pipe_bind(uv_pipe_t *handle,char *name)

{
  byte *pbVar1;
  int __fd;
  int iVar2;
  char *s;
  int *piVar3;
  sockaddr_un saddr;
  
  if ((handle->io_watcher).fd < 0) {
    s = uv__strdup(name);
    if (s == (char *)0x0) {
      iVar2 = -0xc;
    }
    else {
      __fd = uv__socket(1,1,0);
      iVar2 = __fd;
      if (-1 < __fd) {
        saddr.sun_path[0x5e] = '\0';
        saddr.sun_path[0x5f] = '\0';
        saddr.sun_path[0x60] = '\0';
        saddr.sun_path[0x61] = '\0';
        saddr.sun_path[0x62] = '\0';
        saddr.sun_path[99] = '\0';
        saddr.sun_path[100] = '\0';
        saddr.sun_path[0x65] = '\0';
        saddr.sun_path[0x66] = '\0';
        saddr.sun_path[0x67] = '\0';
        saddr.sun_path[0x68] = '\0';
        saddr.sun_path[0x69] = '\0';
        saddr.sun_path[0x6a] = '\0';
        saddr.sun_path[0x6b] = '\0';
        saddr.sun_path[0x4e] = '\0';
        saddr.sun_path[0x4f] = '\0';
        saddr.sun_path[0x50] = '\0';
        saddr.sun_path[0x51] = '\0';
        saddr.sun_path[0x52] = '\0';
        saddr.sun_path[0x53] = '\0';
        saddr.sun_path[0x54] = '\0';
        saddr.sun_path[0x55] = '\0';
        saddr.sun_path[0x56] = '\0';
        saddr.sun_path[0x57] = '\0';
        saddr.sun_path[0x58] = '\0';
        saddr.sun_path[0x59] = '\0';
        saddr.sun_path[0x5a] = '\0';
        saddr.sun_path[0x5b] = '\0';
        saddr.sun_path[0x5c] = '\0';
        saddr.sun_path[0x5d] = '\0';
        saddr.sun_path[0x3e] = '\0';
        saddr.sun_path[0x3f] = '\0';
        saddr.sun_path[0x40] = '\0';
        saddr.sun_path[0x41] = '\0';
        saddr.sun_path[0x42] = '\0';
        saddr.sun_path[0x43] = '\0';
        saddr.sun_path[0x44] = '\0';
        saddr.sun_path[0x45] = '\0';
        saddr.sun_path[0x46] = '\0';
        saddr.sun_path[0x47] = '\0';
        saddr.sun_path[0x48] = '\0';
        saddr.sun_path[0x49] = '\0';
        saddr.sun_path[0x4a] = '\0';
        saddr.sun_path[0x4b] = '\0';
        saddr.sun_path[0x4c] = '\0';
        saddr.sun_path[0x4d] = '\0';
        saddr.sun_path[0x2e] = '\0';
        saddr.sun_path[0x2f] = '\0';
        saddr.sun_path[0x30] = '\0';
        saddr.sun_path[0x31] = '\0';
        saddr.sun_path[0x32] = '\0';
        saddr.sun_path[0x33] = '\0';
        saddr.sun_path[0x34] = '\0';
        saddr.sun_path[0x35] = '\0';
        saddr.sun_path[0x36] = '\0';
        saddr.sun_path[0x37] = '\0';
        saddr.sun_path[0x38] = '\0';
        saddr.sun_path[0x39] = '\0';
        saddr.sun_path[0x3a] = '\0';
        saddr.sun_path[0x3b] = '\0';
        saddr.sun_path[0x3c] = '\0';
        saddr.sun_path[0x3d] = '\0';
        saddr.sun_path[0x1e] = '\0';
        saddr.sun_path[0x1f] = '\0';
        saddr.sun_path[0x20] = '\0';
        saddr.sun_path[0x21] = '\0';
        saddr.sun_path[0x22] = '\0';
        saddr.sun_path[0x23] = '\0';
        saddr.sun_path[0x24] = '\0';
        saddr.sun_path[0x25] = '\0';
        saddr.sun_path[0x26] = '\0';
        saddr.sun_path[0x27] = '\0';
        saddr.sun_path[0x28] = '\0';
        saddr.sun_path[0x29] = '\0';
        saddr.sun_path[0x2a] = '\0';
        saddr.sun_path[0x2b] = '\0';
        saddr.sun_path[0x2c] = '\0';
        saddr.sun_path[0x2d] = '\0';
        saddr.sun_path[0xe] = '\0';
        saddr.sun_path[0xf] = '\0';
        saddr.sun_path[0x10] = '\0';
        saddr.sun_path[0x11] = '\0';
        saddr.sun_path[0x12] = '\0';
        saddr.sun_path[0x13] = '\0';
        saddr.sun_path[0x14] = '\0';
        saddr.sun_path[0x15] = '\0';
        saddr.sun_path[0x16] = '\0';
        saddr.sun_path[0x17] = '\0';
        saddr.sun_path[0x18] = '\0';
        saddr.sun_path[0x19] = '\0';
        saddr.sun_path[0x1a] = '\0';
        saddr.sun_path[0x1b] = '\0';
        saddr.sun_path[0x1c] = '\0';
        saddr.sun_path[0x1d] = '\0';
        saddr.sun_family = 0;
        saddr.sun_path[0] = '\0';
        saddr.sun_path[1] = '\0';
        saddr.sun_path[2] = '\0';
        saddr.sun_path[3] = '\0';
        saddr.sun_path[4] = '\0';
        saddr.sun_path[5] = '\0';
        saddr.sun_path[6] = '\0';
        saddr.sun_path[7] = '\0';
        saddr.sun_path[8] = '\0';
        saddr.sun_path[9] = '\0';
        saddr.sun_path[10] = '\0';
        saddr.sun_path[0xb] = '\0';
        saddr.sun_path[0xc] = '\0';
        saddr.sun_path[0xd] = '\0';
        uv__strscpy(saddr.sun_path,s,0x6c);
        saddr.sun_family = 1;
        iVar2 = bind(__fd,(sockaddr *)&saddr,0x6e);
        if (iVar2 == 0) {
          pbVar1 = (byte *)((long)&handle->flags + 1);
          *pbVar1 = *pbVar1 | 0x20;
          handle->pipe_fname = s;
          (handle->io_watcher).fd = __fd;
          return 0;
        }
        piVar3 = __errno_location();
        iVar2 = -0xd;
        if (*piVar3 != 2) {
          iVar2 = -*piVar3;
        }
        uv__close(__fd);
      }
      uv__free(s);
    }
  }
  else {
    iVar2 = -0x16;
  }
  return iVar2;
}

Assistant:

int uv_pipe_bind(uv_pipe_t* handle, const char* name) {
  struct sockaddr_un saddr;
  const char* pipe_fname = NULL;
  int sockfd = -1;
  int err;

  /* Already bound? */
  if (uv__stream_fd(handle) >= 0)
    return UV_EINVAL;

  /* Make a copy of the file name, it outlives this function's scope. */
  pipe_fname = uv__strdup(name);
  if (pipe_fname == NULL)
    return UV_ENOMEM;

  /* We've got a copy, don't touch the original any more. */
  name = NULL;

  err = uv__socket(AF_UNIX, SOCK_STREAM, 0);
  if (err < 0)
    goto err_socket;
  sockfd = err;

  memset(&saddr, 0, sizeof saddr);
  uv__strscpy(saddr.sun_path, pipe_fname, sizeof(saddr.sun_path));
  saddr.sun_family = AF_UNIX;

  if (bind(sockfd, (struct sockaddr*)&saddr, sizeof saddr)) {
    err = UV__ERR(errno);
    /* Convert ENOENT to EACCES for compatibility with Windows. */
    if (err == UV_ENOENT)
      err = UV_EACCES;

    uv__close(sockfd);
    goto err_socket;
  }

  /* Success. */
  handle->flags |= UV_HANDLE_BOUND;
  handle->pipe_fname = pipe_fname; /* Is a strdup'ed copy. */
  handle->io_watcher.fd = sockfd;
  return 0;

err_socket:
  uv__free((void*)pipe_fname);
  return err;
}